

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearHash.h
# Opt level: O3

void __thiscall
LinearHash<int,_int>::LinearHash
          (LinearHash<int,_int> *this,ion_dictionary_id_t id,ion_key_type_t key_type,
          ion_key_size_t key_size,ion_value_size_t value_size,ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  
  linear_hash_dict_init((ion_dictionary_handler_t *)this);
  (this->super_Dictionary<int,_int>).key_type = key_type;
  (this->super_Dictionary<int,_int>).key_size = key_size;
  (this->super_Dictionary<int,_int>).value_size = value_size;
  (this->super_Dictionary<int,_int>).dict_size = dictionary_size;
  iVar1 = dictionary_create((ion_dictionary_handler_t *)this,
                            &(this->super_Dictionary<int,_int>).dict,id,key_type,key_size,value_size
                            ,dictionary_size);
  (this->super_Dictionary<int,_int>).last_status.error = iVar1;
  return;
}

Assistant:

LinearHash(
	ion_dictionary_id_t		id,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	ion_dictionary_size_t	dictionary_size
) {
	linear_hash_dict_init(&this->handler);

	this->initializeDictionary(id, key_type, key_size, value_size, dictionary_size);
}